

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_tree_visitor.cpp
# Opt level: O3

void __thiscall ir_tree_visitor::visit(ir_tree_visitor *this,NewArrayExpr *ptr)

{
  int iVar1;
  ExpressionWrapper *this_00;
  MallocExpression *this_01;
  BinopExpression *this_02;
  ConstExpression *this_03;
  BinopExpression *this_04;
  ConstExpression *this_05;
  mapped_type *pmVar2;
  undefined4 extraout_var;
  
  (**(ptr->count->super_Base)._vptr_Base)(ptr->count,this);
  this_00 = (ExpressionWrapper *)operator_new(0x10);
  this_01 = (MallocExpression *)operator_new(0x10);
  this_02 = (BinopExpression *)operator_new(0x20);
  this_03 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_03,(int)int_len);
  this_04 = (BinopExpression *)operator_new(0x20);
  this_05 = (ConstExpression *)operator_new(0x10);
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->class_sizes,((ptr->super_Expr).type)->name);
  IRT::ConstExpression::ConstExpression(this_05,(int)*pmVar2);
  iVar1 = (*this->curr_wrapper->_vptr_SubtreeWrapper[2])();
  IRT::BinopExpression::BinopExpression
            (this_04,MUL,(Expression *)this_05,(Expression *)CONCAT44(extraout_var,iVar1));
  IRT::BinopExpression::BinopExpression(this_02,PLUS,(Expression *)this_03,(Expression *)this_04);
  IRT::MallocExpression::MallocExpression(this_01,(Expression *)this_02);
  IRT::ExpressionWrapper::ExpressionWrapper(this_00,(Expression *)this_01);
  this->curr_wrapper = (SubtreeWrapper *)this_00;
  return;
}

Assistant:

void ir_tree_visitor::visit(NewArrayExpr* ptr) {
    ptr->count->accept(this);

    curr_wrapper = new IRT::ExpressionWrapper(new IRT::MallocExpression(
        new IRT::BinopExpression(
            IRT::BinaryOperatorType::PLUS,
            new IRT::ConstExpression(int_len),
            new IRT::BinopExpression(
                    IRT::BinaryOperatorType::MUL,
                    new IRT::ConstExpression(get_class_size(ptr->type)),
                    curr_wrapper->ToExpression()
                    )
        )
    ));
    //type(str)
}